

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallFilesGenerator::GenerateScriptActions
          (cmInstallFilesGenerator *this,ostream *os,Indent indent)

{
  allocator<char> local_49;
  string local_48;
  int local_24;
  ostream *local_20;
  ostream *os_local;
  cmInstallFilesGenerator *this_local;
  Indent indent_local;
  
  local_20 = os;
  os_local = (ostream *)this;
  this_local._4_4_ = indent.Level;
  if (((this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
    AddFilesInstallRule(this,os,&local_48,this_local._4_4_,&this->Files);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  else {
    local_24 = indent.Level;
    cmScriptGenerator::GenerateScriptActions((cmScriptGenerator *)this,os,indent);
  }
  return;
}

Assistant:

void cmInstallFilesGenerator::GenerateScriptActions(std::ostream& os,
                                                    Indent indent)
{
  if (this->ActionsPerConfig) {
    this->cmInstallGenerator::GenerateScriptActions(os, indent);
  } else {
    this->AddFilesInstallRule(os, "", indent, this->Files);
  }
}